

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

exr_result_t exr_attr_string_create(exr_context_t ctxt,exr_attr_string_t *s,char *d)

{
  uint uVar1;
  exr_result_t eVar2;
  size_t sVar3;
  size_t sVar4;
  int32_t len;
  
  if (d == (char *)0x0) {
    len = 0;
  }
  else {
    sVar3 = strlen(d);
    if (sVar3 < 0x7fffffff) {
      len = (int32_t)sVar3;
      sVar4 = sVar3;
    }
    else {
      len = 0;
      if (ctxt == (exr_context_t)0x0) {
        sVar4 = 2;
      }
      else {
        uVar1 = (*ctxt->report_error)(ctxt,3,"Invalid string too long for attribute");
        sVar4 = (size_t)uVar1;
      }
    }
    if (0x7ffffffe < sVar3) {
      return (exr_result_t)sVar4;
    }
  }
  eVar2 = exr_attr_string_create_with_length(ctxt,s,d,len);
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_string_create (exr_context_t ctxt, exr_attr_string_t* s, const char* d)
{
    int32_t len     = 0;
    if (d)
    {
        size_t  fulllen = strlen (d);
        if (fulllen >= (size_t) INT32_MAX)
        {
            if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
            return ctxt->report_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid string too long for attribute");
        }
        len = (int32_t) fulllen;
    }
    return exr_attr_string_create_with_length (ctxt, s, d, len);
}